

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall tetgenmesh::checktet4split(tetgenmesh *this,triface *chktet,int *qflag,double *ccent)

{
  double *pdVar1;
  tetrahedron *pppdVar2;
  tetrahedron ppdVar3;
  tetrahedron ppdVar4;
  tetrahedron ppdVar5;
  TetSizeFunc p_Var6;
  bool bVar7;
  long lVar8;
  long lVar9;
  tetgenmesh *ptVar10;
  double *pdVar11;
  ulong uVar12;
  tetgenmesh *ptVar13;
  int *piVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double vdc [3];
  double vdb [3];
  double vda [3];
  int indx [4];
  double rhs [4];
  double D;
  double N [4] [3];
  double elen [6];
  double vca [3];
  double vbc [3];
  double vab [3];
  double A [4] [4];
  double cosd [6];
  tetgenbehavior *local_2a8;
  double local_288 [4];
  double local_268 [4];
  double local_248 [4];
  int local_228;
  int local_224;
  int local_220;
  triface *local_218;
  tetgenmesh *local_210;
  double local_208 [4];
  double local_1e8;
  double local_1e0;
  double local_1d8 [12];
  double local_178;
  triface *local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148 [4];
  double local_128 [4];
  double local_108 [4];
  double local_e8 [4];
  double adStack_c8 [4];
  double adStack_a8 [8];
  double local_68 [7];
  
  local_2a8 = this->b;
  if (((local_2a8->convex == 0) ||
      ((double)chktet->tet[(long)this->elemattribindex + (long)this->numelemattrib + -1] != -1.0))
     || (NAN((double)chktet->tet[(long)this->elemattribindex + (long)this->numelemattrib + -1]))) {
    *qflag = 0;
    pppdVar2 = chktet->tet;
    ppdVar3 = pppdVar2[7];
    if (ppdVar3 != (tetrahedron)this->dummypoint) {
      ptVar13 = (tetgenmesh *)pppdVar2[4];
      ppdVar4 = pppdVar2[5];
      ppdVar5 = pppdVar2[6];
      lVar8 = 0;
      do {
        dVar20 = (double)(&ptVar13->in)[lVar8] - (double)ppdVar3[lVar8];
        local_248[lVar8] = dVar20;
        local_e8[lVar8] = dVar20;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        pdVar11 = ppdVar4[lVar8];
        pdVar1 = ppdVar3[lVar8];
        local_268[lVar8] = (double)pdVar11 - (double)pdVar1;
        local_e8[lVar8 + 4] = (double)pdVar11 - (double)pdVar1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        pdVar11 = ppdVar5[lVar8];
        pdVar1 = ppdVar3[lVar8];
        local_288[lVar8] = (double)pdVar11 - (double)pdVar1;
        adStack_a8[lVar8] = (double)pdVar11 - (double)pdVar1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        local_108[lVar8] = (double)ppdVar4[lVar8] - (double)(&ptVar13->in)[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        local_128[lVar8] = (double)ppdVar5[lVar8] - (double)ppdVar4[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = 0;
      do {
        local_148[lVar8] = (double)(&ptVar13->in)[lVar8] - (double)ppdVar5[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      local_218 = chktet;
      local_210 = this;
      bVar7 = lu_decmp(this,&local_e8,3,&local_228,&local_1e0,0);
      ptVar10 = local_210;
      if (!bVar7) {
        return 0;
      }
      if ((local_2a8->varvolume != 0) || (local_2a8->fixedvolume != 0)) {
        dVar20 = ABS(local_e8[(long)local_228 * 4] * local_e8[(long)local_224 * 4 + 1] *
                     local_e8[(long)local_220 * 4 + 2]) / 6.0;
        if ((local_2a8->fixedvolume != 0) &&
           (local_2a8->maxvolume <= dVar20 && dVar20 != local_2a8->maxvolume)) {
          *qflag = 1;
        }
        if (((*qflag == 0) && (local_2a8->varvolume != 0)) &&
           ((0.0 < (double)pppdVar2[local_210->volumeboundindex] &&
            ((double)pppdVar2[local_210->volumeboundindex] < dVar20)))) {
          *qflag = 1;
        }
        if (*qflag == 1) {
          local_208[0] = (local_248[2] * local_248[2] +
                         local_248[0] * local_248[0] + local_248[1] * local_248[1]) * 0.5;
          local_208[1] = (local_268[2] * local_268[2] +
                         local_268[0] * local_268[0] + local_268[1] * local_268[1]) * 0.5;
          local_208[2] = (local_288[2] * local_288[2] +
                         local_288[0] * local_288[0] + local_288[1] * local_288[1]) * 0.5;
          lVar8 = 0;
          lu_solve(this,&local_e8,3,&local_228,local_208,0);
          do {
            ccent[lVar8] = (double)ppdVar3[lVar8] + local_208[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          return 1;
        }
      }
      if (local_2a8->metric != 0) {
        local_208[0] = (local_248[2] * local_248[2] +
                       local_248[0] * local_248[0] + local_248[1] * local_248[1]) * 0.5;
        local_208[1] = (local_268[2] * local_268[2] +
                       local_268[0] * local_268[0] + local_268[1] * local_268[1]) * 0.5;
        local_208[2] = (local_288[2] * local_288[2] +
                       local_288[0] * local_288[0] + local_288[1] * local_288[1]) * 0.5;
        lVar8 = 0;
        lu_solve(this,&local_e8,3,&local_228,local_208,0);
        do {
          ccent[lVar8] = (double)ppdVar3[lVar8] + local_208[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        dVar20 = local_208[2] * local_208[2] +
                 local_208[0] * local_208[0] + local_208[1] * local_208[1];
        if (dVar20 < 0.0) {
          dVar20 = sqrt(dVar20);
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        lVar8 = 0;
        do {
          if ((0.0 < (double)local_218->tet[lVar8 + 4][ptVar10->pointmtrindex]) &&
             ((double)local_218->tet[lVar8 + 4][ptVar10->pointmtrindex] < dVar20)) {
            *qflag = 1;
            return 1;
          }
          lVar8 = lVar8 + 1;
          this = (tetgenmesh *)qflag;
        } while (lVar8 != 4);
      }
      p_Var6 = ptVar10->in->tetunsuitable;
      if ((p_Var6 != (TetSizeFunc)0x0) &&
         (bVar7 = (*p_Var6)((double *)ptVar13,(double *)ppdVar4,(double *)ppdVar5,(double *)ppdVar3,
                            (double *)0x0,0.0), this = ptVar13, bVar7)) {
        local_208[0] = (local_248[2] * local_248[2] +
                       local_248[0] * local_248[0] + local_248[1] * local_248[1]) * 0.5;
        local_208[1] = (local_268[2] * local_268[2] +
                       local_268[0] * local_268[0] + local_268[1] * local_268[1]) * 0.5;
        local_208[2] = (local_288[2] * local_288[2] +
                       local_288[0] * local_288[0] + local_288[1] * local_288[1]) * 0.5;
        lVar8 = 0;
        lu_solve(ptVar13,&local_e8,3,&local_228,local_208,0);
        do {
          ccent[lVar8] = (double)ppdVar3[lVar8] + local_208[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        return 1;
      }
      dVar20 = 0.0;
      if (ptVar10->useinsertradius != 0) {
        pppdVar2 = local_218->tet;
        piVar14 = edge2ver;
        uVar12 = 0;
        do {
          ppdVar4 = pppdVar2[orgpivot[*piVar14]];
          ppdVar5 = pppdVar2[destpivot[*piVar14]];
          dVar19 = ((double)ppdVar5[2] - (double)ppdVar4[2]) *
                   ((double)ppdVar5[2] - (double)ppdVar4[2]) +
                   ((double)*ppdVar5 - (double)*ppdVar4) * ((double)*ppdVar5 - (double)*ppdVar4) +
                   ((double)ppdVar5[1] - (double)ppdVar4[1]) *
                   ((double)ppdVar5[1] - (double)ppdVar4[1]);
          if (dVar19 < 0.0) {
            dVar19 = sqrt(dVar19);
          }
          else {
            dVar19 = SQRT(dVar19);
          }
          local_1d8[uVar12 + 0xc] = dVar19;
          if (uVar12 == 0) {
            local_2a8 = (tetgenbehavior *)0x0;
            dVar20 = dVar19;
          }
          else if (dVar19 < dVar20) {
            local_2a8 = (tetgenbehavior *)(uVar12 & 0xffffffff);
            dVar20 = dVar19;
          }
          uVar12 = uVar12 + 1;
          piVar14 = piVar14 + 1;
        } while (uVar12 != 6);
        pdVar11 = pppdVar2[orgpivot[edge2ver[(int)local_2a8]]][local_210->pointinsradiusindex];
        uVar15 = SUB84(pdVar11,0);
        uVar17 = (undefined4)((ulong)pdVar11 >> 0x20);
        pdVar1 = pppdVar2[destpivot[edge2ver[(int)local_2a8]]][local_210->pointinsradiusindex];
        if ((0.0 < (double)pdVar1) &&
           (((double)pdVar11 <= 0.0 || ((double)pdVar1 < (double)pdVar11)))) {
          uVar15 = SUB84(pdVar1,0);
          uVar17 = (undefined4)((ulong)pdVar1 >> 0x20);
        }
        ptVar10 = local_210;
        if ((0.0 <= (double)CONCAT44(uVar17,uVar15) && (double)CONCAT44(uVar17,uVar15) != 0.0) &&
           (uVar12 = -(ulong)(ABS((double)CONCAT44(uVar17,uVar15) - dVar20) / dVar20 <
                             local_210->b->epsilon),
           dVar20 < (double)(~uVar12 & CONCAT44(uVar17,uVar15) | uVar12 & (ulong)dVar20))) {
          return 0;
        }
      }
      if (0.0 < ptVar10->b->minratio) {
        dVar19 = local_248[2] * local_248[2] +
                 local_248[0] * local_248[0] + local_248[1] * local_248[1];
        local_208[0] = dVar19 * 0.5;
        local_218 = (triface *)
                    (local_268[2] * local_268[2] +
                    local_268[0] * local_268[0] + local_268[1] * local_268[1]);
        local_208[1] = (double)local_218 * 0.5;
        local_1e8 = local_288[2] * local_288[2] +
                    local_288[0] * local_288[0] + local_288[1] * local_288[1];
        local_208[2] = local_1e8 * 0.5;
        lVar8 = 0;
        lu_solve(this,&local_e8,3,&local_228,local_208,0);
        ptVar10 = local_210;
        do {
          ccent[lVar8] = (double)ppdVar3[lVar8] + local_208[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        dVar21 = local_208[2] * local_208[2] +
                 local_208[0] * local_208[0] + local_208[1] * local_208[1];
        if (dVar21 < 0.0) {
          dVar21 = sqrt(dVar21);
        }
        else {
          dVar21 = SQRT(dVar21);
        }
        if (ptVar10->useinsertradius == 0) {
          local_178 = dVar19;
          local_170 = local_218;
          local_168 = local_1e8;
          local_160 = local_108[2] * local_108[2] +
                      local_108[0] * local_108[0] + local_108[1] * local_108[1];
          local_158 = local_128[2] * local_128[2] +
                      local_128[0] * local_128[0] + local_128[1] * local_128[1];
          local_150 = local_148[2] * local_148[2] +
                      local_148[0] * local_148[0] + local_148[1] * local_148[1];
          lVar8 = 1;
          do {
            dVar20 = local_1d8[lVar8 + 0xc];
            if (dVar19 <= local_1d8[lVar8 + 0xc]) {
              dVar20 = dVar19;
            }
            lVar8 = lVar8 + 1;
            dVar19 = dVar20;
          } while (lVar8 != 6);
          if (dVar20 < 0.0) {
            dVar20 = sqrt(dVar20);
          }
          else {
            dVar20 = SQRT(dVar20);
          }
        }
        local_1e0 = dVar21 / dVar20;
        pdVar11 = &ptVar10->b->minratio;
        if (*pdVar11 <= local_1e0 && local_1e0 != *pdVar11) {
          return 1;
        }
      }
      if (ptVar10->b->mindihedral <= 0.0) {
        return 0;
      }
      pdVar11 = local_1d8;
      lVar8 = 0;
      do {
        *pdVar11 = 0.0;
        pdVar11[1] = 0.0;
        pdVar11[2] = 0.0;
        *(undefined8 *)((long)local_1d8 + lVar8) = 0x3ff0000000000000;
        lu_solve(this,&local_e8,3,&local_228,pdVar11,0);
        ptVar13 = local_210;
        pdVar11 = pdVar11 + 3;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0x60);
      lVar8 = 0;
      do {
        local_1d8[lVar8 + 9] = (-local_1d8[lVar8] - local_1d8[lVar8 + 3]) - local_1d8[lVar8 + 6];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      pdVar11 = local_1d8;
      lVar8 = 0;
      do {
        dVar20 = local_1d8[lVar8 * 3 + 2] * local_1d8[lVar8 * 3 + 2] +
                 local_1d8[lVar8 * 3] * local_1d8[lVar8 * 3] +
                 local_1d8[lVar8 * 3 + 1] * local_1d8[lVar8 * 3 + 1];
        if (dVar20 < 0.0) {
          dVar20 = sqrt(dVar20);
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        if ((dVar20 == 0.0) && (!NAN(dVar20))) {
          puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
          puts("  the message above, your input data set, and the exact");
          puts("  command line you used to run this program, thank you.");
          exit(2);
        }
        lVar9 = 0;
        do {
          pdVar11[lVar9] = pdVar11[lVar9] / dVar20;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        lVar8 = lVar8 + 1;
        pdVar11 = pdVar11 + 3;
      } while (lVar8 != 4);
      dVar20 = local_1d8[2] * local_1d8[5] +
               local_1d8[0] * local_1d8[3] + local_1d8[1] * local_1d8[4];
      local_68[0] = -dVar20;
      local_68[1] = -(local_1d8[2] * local_1d8[8] +
                     local_1d8[0] * local_1d8[6] + local_1d8[1] * local_1d8[7]);
      local_68[2] = -(local_1d8[2] * local_1d8[0xb] +
                     local_1d8[0] * local_1d8[9] + local_1d8[1] * local_1d8[10]);
      local_68[3] = -(local_1d8[5] * local_1d8[8] +
                     local_1d8[3] * local_1d8[6] + local_1d8[4] * local_1d8[7]);
      local_68[4] = -(local_1d8[5] * local_1d8[0xb] +
                     local_1d8[3] * local_1d8[9] + local_1d8[4] * local_1d8[10]);
      local_68[5] = -(local_1d8[8] * local_1d8[0xb] +
                     local_1d8[6] * local_1d8[9] + local_1d8[7] * local_1d8[10]);
      lVar8 = 1;
      uVar15 = SUB84(dVar20,0);
      uVar17 = (int)((ulong)local_68[0] >> 0x20);
      do {
        dVar20 = local_68[lVar8];
        uVar16 = SUB84(dVar20,0);
        uVar18 = (int)((ulong)dVar20 >> 0x20);
        if (dVar20 <= (double)CONCAT44(uVar17,uVar15)) {
          uVar16 = uVar15;
          uVar18 = uVar17;
        }
        lVar8 = lVar8 + 1;
        uVar15 = uVar16;
        uVar17 = uVar18;
      } while (lVar8 != 6);
      if (ptVar13->cosmindihed <= (double)CONCAT44(uVar18,uVar16) &&
          (double)CONCAT44(uVar18,uVar16) != ptVar13->cosmindihed) {
        local_208[0] = (local_248[2] * local_248[2] +
                       local_248[0] * local_248[0] + local_248[1] * local_248[1]) * 0.5;
        local_208[1] = (local_268[2] * local_268[2] +
                       local_268[0] * local_268[0] + local_268[1] * local_268[1]) * 0.5;
        local_208[2] = (local_288[2] * local_288[2] +
                       local_288[0] * local_288[0] + local_288[1] * local_288[1]) * 0.5;
        lVar8 = 0;
        lu_solve(this,&local_e8,3,&local_228,local_208,0);
        do {
          ccent[lVar8] = (double)ppdVar3[lVar8] + local_208[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int tetgenmesh::checktet4split(triface *chktet, int &qflag, REAL *ccent) 
{
  point pa, pb, pc, pd, *ppt;
  REAL vda[3], vdb[3], vdc[3];
  REAL vab[3], vbc[3], vca[3];
  REAL N[4][3], L[4], cosd[6], elen[6];
  REAL maxcosd, vol, volbnd, smlen = 0, rd;
  REAL A[4][4], rhs[4], D;
  int indx[4];
  int i, j;

  if (b->convex) { // -c
    // Skip this tet if it lies in the exterior.
    if (elemattribute(chktet->tet, numelemattrib - 1) == -1.0) {
      return 0;
    }
  }

  qflag = 0;

  pd = (point) chktet->tet[7];
  if (pd == dummypoint) {
    return 0; // Do not split a hull tet.
  }

  pa = (point) chktet->tet[4];
  pb = (point) chktet->tet[5];
  pc = (point) chktet->tet[6];

  // Get the edge vectors vda: d->a, vdb: d->b, vdc: d->c.
  // Set the matrix A = [vda, vdb, vdc]^T.
  for (i = 0; i < 3; i++) A[0][i] = vda[i] = pa[i] - pd[i];
  for (i = 0; i < 3; i++) A[1][i] = vdb[i] = pb[i] - pd[i];
  for (i = 0; i < 3; i++) A[2][i] = vdc[i] = pc[i] - pd[i];

  // Get the other edge vectors.
  for (i = 0; i < 3; i++) vab[i] = pb[i] - pa[i];
  for (i = 0; i < 3; i++) vbc[i] = pc[i] - pb[i];
  for (i = 0; i < 3; i++) vca[i] = pa[i] - pc[i];

  if (!lu_decmp(A, 3, indx, &D, 0)) {
    // A degenerated tet (vol = 0).
    // This is possible due to the use of exact arithmetic.  We temporarily
    //   leave this tet. It should be fixed by mesh optimization.
    return 0; 
  }

  // Check volume if '-a#' and '-a' options are used.
  if (b->varvolume || b->fixedvolume) {
    vol = fabs(A[indx[0]][0] * A[indx[1]][1] * A[indx[2]][2]) / 6.0;
    if (b->fixedvolume) {
      if (vol > b->maxvolume) {
        qflag = 1;
      }
    } 
    if (!qflag && b->varvolume) {
      volbnd = volumebound(chktet->tet);
      if ((volbnd > 0.0) && (vol > volbnd)) {
        qflag = 1;
      }
    }
    if (qflag == 1) {
      // Calculate the circumcenter of this tet.
      rhs[0] = 0.5 * dot(vda, vda);
      rhs[1] = 0.5 * dot(vdb, vdb);
      rhs[2] = 0.5 * dot(vdc, vdc);
      lu_solve(A, 3, indx, rhs, 0);            
      for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
      return 1;
    }
  }

  if (b->metric) { // -m option. Check mesh size. 
    // Calculate the circumradius of this tet.
    rhs[0] = 0.5 * dot(vda, vda);
    rhs[1] = 0.5 * dot(vdb, vdb);
    rhs[2] = 0.5 * dot(vdc, vdc);
    lu_solve(A, 3, indx, rhs, 0);            
    for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
    rd = sqrt(dot(rhs, rhs));
    // Check if the ccent lies outside one of the prot.balls at vertices.
    ppt = (point *) &(chktet->tet[4]);
    for (i = 0; i < 4; i++) {
      if (ppt[i][pointmtrindex] > 0) {
        if (rd > ppt[i][pointmtrindex]) {
          qflag = 1; // Enforce mesh size.
          return 1;
        }
      }
    }
  }

  if (in->tetunsuitable != NULL) {
    // Execute the user-defined meshing sizing evaluation.
    if ((*(in->tetunsuitable))(pa, pb, pc, pd, NULL, 0)) {
      // Calculate the circumcenter of this tet.
      rhs[0] = 0.5 * dot(vda, vda);
      rhs[1] = 0.5 * dot(vdb, vdb);
      rhs[2] = 0.5 * dot(vdc, vdc);
      lu_solve(A, 3, indx, rhs, 0);            
      for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
      return 1;
    }
  }

  if (useinsertradius) {
    // Do not split this tet if the shortest edge is shorter than the
    //   insertion radius of one of its endpoints.
    triface checkedge;
    point e1, e2;
    REAL rrv, smrrv;

    // Get the shortest edge of this tet.
    checkedge.tet = chktet->tet;
    for (i = 0; i < 6; i++) {
      checkedge.ver = edge2ver[i];
      e1 = org(checkedge);
      e2 = dest(checkedge);
      elen[i] = distance(e1, e2);
      if (i == 0) {
        smlen = elen[i];
        j = 0;
      } else {
        if (elen[i] < smlen) {
          smlen = elen[i];
          j = i;
        }
      }
    }
    // Check if the edge is too short.
    checkedge.ver = edge2ver[j];
    // Get the smallest rrv of e1 and e2.
    // Note: if rrv of e1 and e2 is zero. Do not use it.
    e1 = org(checkedge);
    smrrv = getpointinsradius(e1);
    e2 = dest(checkedge);
    rrv = getpointinsradius(e2);
    if (rrv > 0) {
      if (smrrv > 0) {
        if (rrv < smrrv) {
          smrrv = rrv;
        }
      } else {
        smrrv = rrv;
      }
    }
    if (smrrv > 0) {
      // To avoid rounding error, round smrrv before doing comparison.
      if ((fabs(smrrv - smlen) / smlen) < b->epsilon) {
        smrrv = smlen;
      }
      if (smrrv > smlen) {
        return 0;
      }
    }
  } // if (useinsertradius)

  // Check the radius-edge ratio. Set by -q#.
  if (b->minratio > 0) { 
    // Calculate the circumcenter and radius of this tet.
    rhs[0] = 0.5 * dot(vda, vda);
    rhs[1] = 0.5 * dot(vdb, vdb);
    rhs[2] = 0.5 * dot(vdc, vdc);
    lu_solve(A, 3, indx, rhs, 0);            
    for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
    rd = sqrt(dot(rhs, rhs));
    if (!useinsertradius) {
      // Calculate the shortest edge length.
      elen[0] = dot(vda, vda);
      elen[1] = dot(vdb, vdb);
      elen[2] = dot(vdc, vdc);
      elen[3] = dot(vab, vab);
      elen[4] = dot(vbc, vbc);
      elen[5] = dot(vca, vca);
      smlen = elen[0]; //sidx = 0;
      for (i = 1; i < 6; i++) {
        if (smlen > elen[i]) { 
          smlen = elen[i]; //sidx = i; 
        }
      }
      smlen = sqrt(smlen);
    }
    D = rd / smlen;
    if (D > b->minratio) {
      // A bad radius-edge ratio.
      return 1;
    }
  }

  // Check the minimum dihedral angle. Set by -qq#.
  if (b->mindihedral > 0) { 
    // Compute the 4 face normals (N[0], ..., N[3]).
    for (j = 0; j < 3; j++) {
      for (i = 0; i < 3; i++) N[j][i] = 0.0;
      N[j][j] = 1.0;  // Positive means the inside direction
      lu_solve(A, 3, indx, N[j], 0);
    }
    for (i = 0; i < 3; i++) N[3][i] = - N[0][i] - N[1][i] - N[2][i];
    // Normalize the normals.
    for (i = 0; i < 4; i++) {
      L[i] = sqrt(dot(N[i], N[i]));
      if (L[i] == 0) {
        terminatetetgen(this, 2);
      }
      for (j = 0; j < 3; j++) N[i][j] /= L[i];
    }
    // Calculate the six dihedral angles.
    cosd[0] = -dot(N[0], N[1]); // Edge cd, bd, bc.
    cosd[1] = -dot(N[0], N[2]);
    cosd[2] = -dot(N[0], N[3]);
    cosd[3] = -dot(N[1], N[2]); // Edge ad, ac
    cosd[4] = -dot(N[1], N[3]);
    cosd[5] = -dot(N[2], N[3]); // Edge ab
    // Get the smallest dihedral angle.
    //maxcosd = mincosd = cosd[0];
    maxcosd = cosd[0];
    for (i = 1; i < 6; i++) {
      //if (cosd[i] > maxcosd) maxcosd = cosd[i];
      maxcosd = (cosd[i] > maxcosd ? cosd[i] : maxcosd);
      //mincosd = (cosd[i] < mincosd ? cosd[i] : maxcosd);
    }
    if (maxcosd > cosmindihed) {
      // Calculate the circumcenter of this tet.
      // A bad dihedral angle.
      //if ((b->quality & 1) == 0) {
        rhs[0] = 0.5 * dot(vda, vda);
        rhs[1] = 0.5 * dot(vdb, vdb);
        rhs[2] = 0.5 * dot(vdc, vdc);
        lu_solve(A, 3, indx, rhs, 0);            
        for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
        //*rd = sqrt(dot(rhs, rhs));
      //}
      return 1;
    }
  }

  return 0;
}